

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O3

optional<unsigned_long> __thiscall
absl::lts_20250127::status_internal::FindPayloadIndexByUrl
          (status_internal *this,Payloads *payloads,string_view type_url)

{
  int iVar1;
  const_reference pVVar2;
  _Storage<unsigned_long,_true> unaff_RBX;
  ulong unaff_RBP;
  optional<unsigned_long> oVar3;
  
  if (this == (status_internal *)0x0) {
    unaff_RBP = 0;
  }
  else {
    if (*(ulong *)this < 2) {
      unaff_RBX._M_value = 0;
    }
    else {
      unaff_RBX._M_value = 0;
      do {
        pVVar2 = InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                 ::operator[]((InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                               *)this,unaff_RBX._M_value);
        if ((Payloads *)(pVVar2->type_url)._M_string_length == payloads) {
          unaff_RBP = CONCAT71((int7)(unaff_RBP >> 8),1);
          if (payloads == (Payloads *)0x0) goto LAB_00323cd2;
          iVar1 = bcmp((pVVar2->type_url)._M_dataplus._M_p,(void *)type_url._M_len,(size_t)payloads)
          ;
          if (iVar1 == 0) goto LAB_00323cd2;
        }
        unaff_RBX._M_value = unaff_RBX._M_value + 1;
      } while (unaff_RBX._M_value < *(ulong *)this >> 1);
    }
    unaff_RBP = 0;
  }
LAB_00323cd2:
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = unaff_RBP & 0xffffffff;
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = unaff_RBX._M_value;
  return (optional<unsigned_long>)
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

static absl::optional<size_t> FindPayloadIndexByUrl(
    const Payloads* payloads, absl::string_view type_url) {
  if (payloads == nullptr) return absl::nullopt;

  for (size_t i = 0; i < payloads->size(); ++i) {
    if ((*payloads)[i].type_url == type_url) return i;
  }

  return absl::nullopt;
}